

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

size_t HUF_writeCTable_wksp
                 (void *dst,size_t maxDstSize,HUF_CElt *CTable,uint maxSymbolValue,uint huffLog,
                 void *workspace,size_t workspaceSize)

{
  uint uVar1;
  size_t hSize;
  HUF_WriteCTableWksp *wksp;
  U32 n;
  BYTE *op;
  void *workspace_local;
  uint huffLog_local;
  uint maxSymbolValue_local;
  HUF_CElt *CTable_local;
  size_t maxDstSize_local;
  void *dst_local;
  
  if (workspaceSize < 0x2c0) {
    dst_local = (void *)0xffffffffffffffff;
  }
  else if (maxSymbolValue < 0x100) {
    *(undefined1 *)((long)workspace + 0x1b4) = 0;
    for (wksp._4_4_ = 1; wksp._4_4_ < huffLog + 1; wksp._4_4_ = wksp._4_4_ + 1) {
      *(char *)((long)workspace + (ulong)wksp._4_4_ + 0x1b4) =
           ((char)huffLog + '\x01') - (char)wksp._4_4_;
    }
    for (wksp._4_4_ = 0; wksp._4_4_ < maxSymbolValue; wksp._4_4_ = wksp._4_4_ + 1) {
      *(undefined1 *)((long)workspace + (ulong)wksp._4_4_ + 0x1c1) =
           *(undefined1 *)((long)workspace + (ulong)CTable[wksp._4_4_].nbBits + 0x1b4);
    }
    dst_local = (void *)HUF_compressWeights((void *)((long)dst + 1),maxDstSize - 1,
                                            (void *)((long)workspace + 0x1c1),(ulong)maxSymbolValue,
                                            workspace,0x1b4);
    uVar1 = ERR_isError((size_t)dst_local);
    if (uVar1 == 0) {
      if (dst_local < (void *)0x2 || (void *)(ulong)(maxSymbolValue >> 1) <= dst_local) {
        if (maxSymbolValue < 0x81) {
          if (maxDstSize < (maxSymbolValue + 1 >> 1) + 1) {
            dst_local = (void *)0xffffffffffffffba;
          }
          else {
            *(char *)dst = (char)maxSymbolValue + '\x7f';
            *(undefined1 *)((long)workspace + (ulong)maxSymbolValue + 0x1c1) = 0;
            for (wksp._4_4_ = 0; wksp._4_4_ < maxSymbolValue; wksp._4_4_ = wksp._4_4_ + 2) {
              *(char *)((long)dst + (ulong)((wksp._4_4_ >> 1) + 1)) =
                   *(char *)((long)workspace + (ulong)wksp._4_4_ + 0x1c1) * '\x10' +
                   *(char *)((long)workspace + (ulong)(wksp._4_4_ + 1) + 0x1c1);
            }
            dst_local = (void *)(ulong)((maxSymbolValue + 1 >> 1) + 1);
          }
        }
        else {
          dst_local = (void *)0xffffffffffffffff;
        }
      }
      else {
        *(char *)dst = (char)dst_local;
        dst_local = (void *)((long)dst_local + 1);
      }
    }
  }
  else {
    dst_local = (void *)0xffffffffffffffd2;
  }
  return (size_t)dst_local;
}

Assistant:

size_t HUF_writeCTable_wksp(void* dst, size_t maxDstSize,
                            const HUF_CElt* CTable, unsigned maxSymbolValue, unsigned huffLog,
                            void* workspace, size_t workspaceSize)
{
    BYTE* op = (BYTE*)dst;
    U32 n;
    HUF_WriteCTableWksp* wksp = (HUF_WriteCTableWksp*)workspace;

    /* check conditions */
    if (workspaceSize < sizeof(HUF_WriteCTableWksp)) return ERROR(GENERIC);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);

    /* convert to weight */
    wksp->bitsToWeight[0] = 0;
    for (n=1; n<huffLog+1; n++)
        wksp->bitsToWeight[n] = (BYTE)(huffLog + 1 - n);
    for (n=0; n<maxSymbolValue; n++)
        wksp->huffWeight[n] = wksp->bitsToWeight[CTable[n].nbBits];

    /* attempt weights compression by FSE */
    {   CHECK_V_F(hSize, HUF_compressWeights(op+1, maxDstSize-1, wksp->huffWeight, maxSymbolValue, &wksp->wksp, sizeof(wksp->wksp)) );
        if ((hSize>1) & (hSize < maxSymbolValue/2)) {   /* FSE compressed */
            op[0] = (BYTE)hSize;
            return hSize+1;
    }   }

    /* write raw values as 4-bits (max : 15) */
    if (maxSymbolValue > (256-128)) return ERROR(GENERIC);   /* should not happen : likely means source cannot be compressed */
    if (((maxSymbolValue+1)/2) + 1 > maxDstSize) return ERROR(dstSize_tooSmall);   /* not enough space within dst buffer */
    op[0] = (BYTE)(128 /*special case*/ + (maxSymbolValue-1));
    wksp->huffWeight[maxSymbolValue] = 0;   /* to be sure it doesn't cause msan issue in final combination */
    for (n=0; n<maxSymbolValue; n+=2)
        op[(n/2)+1] = (BYTE)((wksp->huffWeight[n] << 4) + wksp->huffWeight[n+1]);
    return ((maxSymbolValue+1)/2) + 1;
}